

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O3

void __thiscall SBarInfoCommandFlowControl::Reset(SBarInfoCommandFlowControl *this)

{
  SBarInfoCommand **ppSVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    uVar5 = (ulong)this->commands[lVar4].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Count;
    if (uVar5 != 0) {
      ppSVar1 = this->commands[lVar4].super_TArray<SBarInfoCommand_*,_SBarInfoCommand_*>.Array;
      lVar4 = 0;
      do {
        (**(code **)(**(long **)((long)ppSVar1 + lVar4) + 0x20))();
        lVar4 = lVar4 + 8;
      } while (uVar5 << 3 != lVar4);
    }
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  return;
}

Assistant:

void	Reset()
		{
			for(unsigned int i = 0;i < 2;i++)
			{
				for(auto command : commands[i])
					command->Reset();
			}
		}